

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

char * portfwdmgr_connect(PortFwdManager *mgr,Channel **chan_ret,char *hostname,int port,
                         SshChannel *c,int addressfamily)

{
  PortFwdManager *pPVar1;
  PortForwarding *pf_00;
  Socket *pSVar2;
  char *err_ret_1;
  char *err_ret;
  PortForwarding *pf;
  char *dummy_realhost;
  char *err;
  SockAddr *addr;
  SshChannel *pSStack_38;
  int addressfamily_local;
  SshChannel *c_local;
  char *pcStack_28;
  int port_local;
  char *hostname_local;
  Channel **chan_ret_local;
  PortFwdManager *mgr_local;
  
  pf = (PortForwarding *)0x0;
  addr._4_4_ = addressfamily;
  pSStack_38 = c;
  c_local._4_4_ = port;
  pcStack_28 = hostname;
  hostname_local = (char *)chan_ret;
  chan_ret_local = (Channel **)mgr;
  err = (char *)name_lookup(hostname,port,(char **)&pf,mgr->conf,addressfamily,(LogContext *)0x0,
                            (char *)0x0);
  dummy_realhost = sk_addr_error((SockAddr *)err);
  if (dummy_realhost == (char *)0x0) {
    pf_00 = new_portfwd_state();
    *(Channel **)hostname_local = &pf_00->chan;
    (pf_00->plug).vt = &PortForwarding_plugvt;
    (pf_00->chan).initial_fixed_window_size = 0;
    (pf_00->chan).vt = &PortForwarding_channelvt;
    pf_00->input_wanted = true;
    pf_00->ready = true;
    pf_00->c = pSStack_38;
    pf_00->cl = (ConnectionLayer *)*chan_ret_local;
    pf_00->socks_state = SOCKS_NONE;
    pSVar2 = new_connection((SockAddr *)err,(char *)pf,c_local._4_4_,false,true,false,false,
                            &pf_00->plug,(Conf *)chan_ret_local[1],(Interactor *)0x0);
    pf_00->s = pSVar2;
    safefree(pf);
    dummy_realhost = sk_socket_error(pf_00->s);
    if (dummy_realhost == (char *)0x0) {
      mgr_local = (PortFwdManager *)0x0;
    }
    else {
      pPVar1 = (PortFwdManager *)dupstr(dummy_realhost);
      sk_close(pf_00->s);
      free_portfwd_state(pf_00);
      hostname_local[0] = '\0';
      hostname_local[1] = '\0';
      hostname_local[2] = '\0';
      hostname_local[3] = '\0';
      hostname_local[4] = '\0';
      hostname_local[5] = '\0';
      hostname_local[6] = '\0';
      hostname_local[7] = '\0';
      mgr_local = pPVar1;
    }
  }
  else {
    pPVar1 = (PortFwdManager *)dupstr(dummy_realhost);
    sk_addr_free((SockAddr *)err);
    safefree(pf);
    mgr_local = pPVar1;
  }
  return (char *)mgr_local;
}

Assistant:

char *portfwdmgr_connect(PortFwdManager *mgr, Channel **chan_ret,
                         char *hostname, int port, SshChannel *c,
                         int addressfamily)
{
    SockAddr *addr;
    const char *err;
    char *dummy_realhost = NULL;
    struct PortForwarding *pf;

    /*
     * Try to find host.
     */
    addr = name_lookup(hostname, port, &dummy_realhost, mgr->conf,
                       addressfamily, NULL, NULL);
    if ((err = sk_addr_error(addr)) != NULL) {
        char *err_ret = dupstr(err);
        sk_addr_free(addr);
        sfree(dummy_realhost);
        return err_ret;
    }

    /*
     * Open socket.
     */
    pf = new_portfwd_state();
    *chan_ret = &pf->chan;
    pf->plug.vt = &PortForwarding_plugvt;
    pf->chan.initial_fixed_window_size = 0;
    pf->chan.vt = &PortForwarding_channelvt;
    pf->input_wanted = true;
    pf->ready = true;
    pf->c = c;
    pf->cl = mgr->cl;
    pf->socks_state = SOCKS_NONE;

    pf->s = new_connection(addr, dummy_realhost, port,
                           false, true, false, false, &pf->plug, mgr->conf,
                           NULL);
    sfree(dummy_realhost);
    if ((err = sk_socket_error(pf->s)) != NULL) {
        char *err_ret = dupstr(err);
        sk_close(pf->s);
        free_portfwd_state(pf);
        *chan_ret = NULL;
        return err_ret;
    }

    return NULL;
}